

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O2

shared_ptr<MPL::ModelPackageItemInfo> __thiscall
MPL::detail::ModelPackageImpl::getRootModel(ModelPackageImpl *this)

{
  JsonMap *pJVar1;
  bool bVar2;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  shared_ptr<MPL::ModelPackageItemInfo> sVar3;
  allocator<char> local_61;
  string rootModelIdentifier;
  string local_40;
  
  pJVar1 = *(JsonMap **)((long)&in_RSI[3].field_2 + 8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rootModelIdentifier,"rootModelIdentifier",(allocator<char> *)&local_40);
  bVar2 = JsonMap::hasKey(pJVar1,&rootModelIdentifier);
  std::__cxx11::string::~string((string *)&rootModelIdentifier);
  if (bVar2) {
    pJVar1 = *(JsonMap **)((long)&in_RSI[3].field_2 + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"rootModelIdentifier",&local_61);
    JsonMap::getString(&rootModelIdentifier,pJVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    findItem(this,in_RSI);
    std::__cxx11::string::~string((string *)&rootModelIdentifier);
    sVar3.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar3.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<MPL::ModelPackageItemInfo>)
           sVar3.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Failed to look up root model");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<ModelPackageItemInfo> ModelPackageImpl::getRootModel() const
{
    if (false == m_manifest->hasKey(kModelPackageRootModelKey)) {
        throw std::runtime_error("Failed to look up root model");
    }
    
    auto rootModelIdentifier = m_manifest->getString(kModelPackageRootModelKey);
    return findItem(rootModelIdentifier);
}